

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# menudef.cpp
# Opt level: O1

bool ReplaceMenu(FScanner *sc,FMenuDescriptor *desc)

{
  uint uVar1;
  FMenuDescriptor *pFVar2;
  Node *pNVar3;
  Node *pNVar4;
  FName local_c;
  
  uVar1 = (desc->mMenuName).Index;
  pNVar4 = MenuDescriptors.Nodes + (MenuDescriptors.Size - 1 & uVar1);
  while ((pNVar3 = pNVar4, pNVar3 != (Node *)0x0 && (pNVar3->Next != (Node *)0x1))) {
    pNVar4 = pNVar3->Next;
    if ((pNVar3->Pair).Key.Index == uVar1) {
LAB_0033863e:
      if ((pNVar3 != (Node *)0x0) &&
         (pFVar2 = (pNVar3->Pair).Value, pFVar2 != (FMenuDescriptor *)0x0)) {
        if ((pFVar2->mClass != (PClass *)0x0) && (pFVar2->mClass != desc->mClass)) {
          FScanner::ScriptMessage
                    (sc,"Tried to replace menu \'%s\' with a menu of different type",
                     FName::NameData.NameArray[(int)uVar1].Text);
          return true;
        }
        (*pFVar2->_vptr_FMenuDescriptor[1])(pFVar2);
      }
      local_c.Index = (desc->mMenuName).Index;
      pNVar4 = TMap<FName,_FMenuDescriptor_*,_THashTraits<FName>,_TValueTraits<FMenuDescriptor_*>_>
               ::GetNode(&MenuDescriptors,&local_c);
      (pNVar4->Pair).Value = desc;
      return false;
    }
  }
  pNVar3 = (Node *)0x0;
  goto LAB_0033863e;
}

Assistant:

static bool ReplaceMenu(FScanner &sc, FMenuDescriptor *desc)
{
	FMenuDescriptor **pOld = MenuDescriptors.CheckKey(desc->mMenuName);
	if (pOld != NULL && *pOld != NULL) 
	{
		if (CheckCompatible(desc, *pOld))
		{
			delete *pOld;
		}
		else
		{
			sc.ScriptMessage("Tried to replace menu '%s' with a menu of different type", desc->mMenuName.GetChars());
			return true;
		}
	}
	MenuDescriptors[desc->mMenuName] = desc;
	return false;
}